

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemGrow(Mem *pMem,int n,int preserve)

{
  int iVar1;
  char *pcVar2;
  int local_18;
  int local_14;
  int preserve_local;
  int n_local;
  Mem *pMem_local;
  
  local_14 = n;
  if (n < 0x20) {
    local_14 = 0x20;
  }
  iVar1 = sqlite3DbMallocSize(pMem->db,pMem->zMalloc);
  local_18 = preserve;
  if (iVar1 < local_14) {
    if ((preserve == 0) || (pMem->z != pMem->zMalloc)) {
      sqlite3DbFree(pMem->db,pMem->zMalloc);
      pcVar2 = (char *)sqlite3DbMallocRaw(pMem->db,local_14);
      pMem->zMalloc = pcVar2;
    }
    else {
      pcVar2 = (char *)sqlite3DbReallocOrFree(pMem->db,pMem->z,local_14);
      pMem->zMalloc = pcVar2;
      pMem->z = pcVar2;
      local_18 = 0;
    }
  }
  if ((((pMem->z != (char *)0x0) && (local_18 != 0)) && (pMem->zMalloc != (char *)0x0)) &&
     (pMem->z != pMem->zMalloc)) {
    memcpy(pMem->zMalloc,pMem->z,(long)pMem->n);
  }
  if (((pMem->flags & 0x400) != 0) && (pMem->xDel != (_func_void_void_ptr *)0x0)) {
    (*pMem->xDel)(pMem->z);
  }
  pMem->z = pMem->zMalloc;
  if (pMem->z == (char *)0x0) {
    pMem->flags = 1;
  }
  else {
    pMem->flags = pMem->flags & 0xe7ff;
  }
  pMem->xDel = (_func_void_void_ptr *)0x0;
  iVar1 = 7;
  if (pMem->z != (char *)0x0) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemGrow(Mem *pMem, int n, int preserve){
  assert( 1 >=
    ((pMem->zMalloc && pMem->zMalloc==pMem->z) ? 1 : 0) +
    (((pMem->flags&MEM_Dyn)&&pMem->xDel) ? 1 : 0) + 
    ((pMem->flags&MEM_Ephem) ? 1 : 0) + 
    ((pMem->flags&MEM_Static) ? 1 : 0)
  );
  assert( (pMem->flags&MEM_RowSet)==0 );

  /* If the preserve flag is set to true, then the memory cell must already
  ** contain a valid string or blob value.  */
  assert( preserve==0 || pMem->flags&(MEM_Blob|MEM_Str) );

  if( n<32 ) n = 32;
  if( sqlite3DbMallocSize(pMem->db, pMem->zMalloc)<n ){
    if( preserve && pMem->z==pMem->zMalloc ){
      pMem->z = pMem->zMalloc = sqlite3DbReallocOrFree(pMem->db, pMem->z, n);
      preserve = 0;
    }else{
      sqlite3DbFree(pMem->db, pMem->zMalloc);
      pMem->zMalloc = sqlite3DbMallocRaw(pMem->db, n);
    }
  }

  if( pMem->z && preserve && pMem->zMalloc && pMem->z!=pMem->zMalloc ){
    memcpy(pMem->zMalloc, pMem->z, pMem->n);
  }
  if( pMem->flags&MEM_Dyn && pMem->xDel ){
    assert( pMem->xDel!=SQLITE_DYNAMIC );
    pMem->xDel((void *)(pMem->z));
  }

  pMem->z = pMem->zMalloc;
  if( pMem->z==0 ){
    pMem->flags = MEM_Null;
  }else{
    pMem->flags &= ~(MEM_Ephem|MEM_Static);
  }
  pMem->xDel = 0;
  return (pMem->z ? SQLITE_OK : SQLITE_NOMEM);
}